

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateBuilderParsingCode
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *pcVar2;
  string_view text;
  size_t sStack_20;
  
  bVar1 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
  if (bVar1) {
    pcVar2 = 
    "java.lang.String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
    ;
    sStack_20 = 0x61;
  }
  else {
    pcVar2 = 
    "com.google.protobuf.ByteString bs = input.readBytes();\n$set_oneof_case_message$;\n$oneof_name$_ = bs;\n"
    ;
    sStack_20 = 0x65;
  }
  text._M_str = pcVar2;
  text._M_len = sStack_20;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableStringFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
                   "java.lang.String s = input.readStringRequireUtf8();\n"
                   "$set_oneof_case_message$;\n"
                   "$oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "com.google.protobuf.ByteString bs = input.readBytes();\n"
                   "$set_oneof_case_message$;\n"
                   "$oneof_name$_ = bs;\n");
  }
}